

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_field_lite.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::RepeatedImmutableMessageFieldLiteGenerator::GenerateMembers
          (RepeatedImmutableMessageFieldLiteGenerator *this,Printer *printer)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  
  variables = &this->variables_;
  io::Printer::Print(printer,variables,
                     "private com.google.protobuf.Internal.ProtobufList<$type$> $name$_;\n");
  PrintExtraFieldInfo(variables,printer);
  WriteFieldDocComment(printer,this->descriptor_);
  io::Printer::Print(printer,variables,
                     "$deprecation$public java.util.List<$type$> get$capitalized_name$List() {\n  return $name$_;\n}\n"
                    );
  WriteFieldDocComment(printer,this->descriptor_);
  io::Printer::Print(printer,variables,
                     "$deprecation$public java.util.List<? extends $type$OrBuilder> \n    get$capitalized_name$OrBuilderList() {\n  return $name$_;\n}\n"
                    );
  WriteFieldDocComment(printer,this->descriptor_);
  io::Printer::Print(printer,variables,
                     "$deprecation$public int get$capitalized_name$Count() {\n  return $name$_.size();\n}\n"
                    );
  WriteFieldDocComment(printer,this->descriptor_);
  io::Printer::Print(printer,variables,
                     "$deprecation$public $type$ get$capitalized_name$(int index) {\n  return $name$_.get(index);\n}\n"
                    );
  WriteFieldDocComment(printer,this->descriptor_);
  io::Printer::Print(printer,variables,
                     "$deprecation$public $type$OrBuilder get$capitalized_name$OrBuilder(\n    int index) {\n  return $name$_.get(index);\n}\n"
                    );
  io::Printer::Print(printer,variables,
                     "private void ensure$capitalized_name$IsMutable() {\n  if (!$is_mutable$) {\n    $name$_ =\n        com.google.protobuf.GeneratedMessageLite.mutableCopy($name$_);\n   }\n}\n\n"
                    );
  WriteFieldDocComment(printer,this->descriptor_);
  io::Printer::Print(printer,variables,
                     "private void set$capitalized_name$(\n    int index, $type$ value) {\n  if (value == null) {\n    throw new NullPointerException();\n  }\n  ensure$capitalized_name$IsMutable();\n  $name$_.set(index, value);\n}\n"
                    );
  WriteFieldDocComment(printer,this->descriptor_);
  io::Printer::Print(printer,variables,
                     "private void set$capitalized_name$(\n    int index, $type$.Builder builderForValue) {\n  ensure$capitalized_name$IsMutable();\n  $name$_.set(index, builderForValue.build());\n}\n"
                    );
  WriteFieldDocComment(printer,this->descriptor_);
  io::Printer::Print(printer,variables,
                     "private void add$capitalized_name$($type$ value) {\n  if (value == null) {\n    throw new NullPointerException();\n  }\n  ensure$capitalized_name$IsMutable();\n  $name$_.add(value);\n}\n"
                    );
  WriteFieldDocComment(printer,this->descriptor_);
  io::Printer::Print(printer,variables,
                     "private void add$capitalized_name$(\n    int index, $type$ value) {\n  if (value == null) {\n    throw new NullPointerException();\n  }\n  ensure$capitalized_name$IsMutable();\n  $name$_.add(index, value);\n}\n"
                    );
  WriteFieldDocComment(printer,this->descriptor_);
  io::Printer::Print(printer,variables,
                     "private void add$capitalized_name$(\n    $type$.Builder builderForValue) {\n  ensure$capitalized_name$IsMutable();\n  $name$_.add(builderForValue.build());\n}\n"
                    );
  WriteFieldDocComment(printer,this->descriptor_);
  io::Printer::Print(printer,variables,
                     "private void add$capitalized_name$(\n    int index, $type$.Builder builderForValue) {\n  ensure$capitalized_name$IsMutable();\n  $name$_.add(index, builderForValue.build());\n}\n"
                    );
  WriteFieldDocComment(printer,this->descriptor_);
  io::Printer::Print(printer,variables,
                     "private void addAll$capitalized_name$(\n    java.lang.Iterable<? extends $type$> values) {\n  ensure$capitalized_name$IsMutable();\n  com.google.protobuf.AbstractMessageLite.addAll(\n      values, $name$_);\n}\n"
                    );
  WriteFieldDocComment(printer,this->descriptor_);
  io::Printer::Print(printer,variables,
                     "private void clear$capitalized_name$() {\n  $name$_ = emptyProtobufList();\n}\n"
                    );
  WriteFieldDocComment(printer,this->descriptor_);
  io::Printer::Print(printer,variables,
                     "private void remove$capitalized_name$(int index) {\n  ensure$capitalized_name$IsMutable();\n  $name$_.remove(index);\n}\n"
                    );
  return;
}

Assistant:

void RepeatedImmutableMessageFieldLiteGenerator::
GenerateMembers(io::Printer* printer) const {
  printer->Print(variables_,
    "private com.google.protobuf.Internal.ProtobufList<$type$> $name$_;\n");
  PrintExtraFieldInfo(variables_, printer);
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$public java.util.List<$type$> get$capitalized_name$List() {\n"
    "  return $name$_;\n"   // note:  unmodifiable list
    "}\n");
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$public java.util.List<? extends $type$OrBuilder> \n"
    "    get$capitalized_name$OrBuilderList() {\n"
    "  return $name$_;\n"
    "}\n");
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$public int get$capitalized_name$Count() {\n"
    "  return $name$_.size();\n"
    "}\n");
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$public $type$ get$capitalized_name$(int index) {\n"
    "  return $name$_.get(index);\n"
    "}\n");
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$public $type$OrBuilder get$capitalized_name$OrBuilder(\n"
    "    int index) {\n"
    "  return $name$_.get(index);\n"
    "}\n");

  printer->Print(variables_,
    "private void ensure$capitalized_name$IsMutable() {\n"
    "  if (!$is_mutable$) {\n"
    "    $name$_ =\n"
    "        com.google.protobuf.GeneratedMessageLite.mutableCopy($name$_);\n"
    "   }\n"
    "}\n"
    "\n");

  // Builder setRepeatedField(int index, Field value)
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "private void set$capitalized_name$(\n"
    "    int index, $type$ value) {\n"
    "  if (value == null) {\n"
    "    throw new NullPointerException();\n"
    "  }\n"
    "  ensure$capitalized_name$IsMutable();\n"
    "  $name$_.set(index, value);\n"
    "}\n");

  // Builder setRepeatedField(int index, Field.Builder builderForValue)
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "private void set$capitalized_name$(\n"
    "    int index, $type$.Builder builderForValue) {\n"
    "  ensure$capitalized_name$IsMutable();\n"
    "  $name$_.set(index, builderForValue.build());\n"
    "}\n");

  // Builder addRepeatedField(Field value)
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "private void add$capitalized_name$($type$ value) {\n"
    "  if (value == null) {\n"
    "    throw new NullPointerException();\n"
    "  }\n"
    "  ensure$capitalized_name$IsMutable();\n"
    "  $name$_.add(value);\n"
    "}\n");

  // Builder addRepeatedField(int index, Field value)
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "private void add$capitalized_name$(\n"
    "    int index, $type$ value) {\n"
    "  if (value == null) {\n"
    "    throw new NullPointerException();\n"
    "  }\n"
    "  ensure$capitalized_name$IsMutable();\n"
    "  $name$_.add(index, value);\n"
    "}\n");
  // Builder addRepeatedField(Field.Builder builderForValue)
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "private void add$capitalized_name$(\n"
    "    $type$.Builder builderForValue) {\n"
    "  ensure$capitalized_name$IsMutable();\n"
    "  $name$_.add(builderForValue.build());\n"
    "}\n");

  // Builder addRepeatedField(int index, Field.Builder builderForValue)
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "private void add$capitalized_name$(\n"
    "    int index, $type$.Builder builderForValue) {\n"
    "  ensure$capitalized_name$IsMutable();\n"
    "  $name$_.add(index, builderForValue.build());\n"
    "}\n");

  // Builder addAllRepeatedField(Iterable<Field> values)
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "private void addAll$capitalized_name$(\n"
    "    java.lang.Iterable<? extends $type$> values) {\n"
    "  ensure$capitalized_name$IsMutable();\n"
    "  com.google.protobuf.AbstractMessageLite.addAll(\n"
    "      values, $name$_);\n"
    "}\n");

  // Builder clearAllRepeatedField()
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "private void clear$capitalized_name$() {\n"
    "  $name$_ = emptyProtobufList();\n"
    "}\n");

  // Builder removeRepeatedField(int index)
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "private void remove$capitalized_name$(int index) {\n"
    "  ensure$capitalized_name$IsMutable();\n"
    "  $name$_.remove(index);\n"
    "}\n");
}